

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O2

void __thiscall
wasm::OptimizationOptions::addPassArg(OptimizationOptions *this,string *key,string *value)

{
  bool bVar1;
  char cVar2;
  string *psVar3;
  __normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>
  __tmp;
  pointer pPVar4;
  pointer __lhs;
  undefined1 local_1b0 [392];
  
  __lhs = (this->passes).
          super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  do {
    pPVar4 = __lhs;
    if (pPVar4 == (this->passes).
                  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      psVar3 = (string *)wasm::PassRegistry::get();
      cVar2 = wasm::PassRegistry::containsPass(psVar3);
      if (cVar2 == '\0') {
        ToolOptions::addPassArg(&this->super_ToolOptions,key,value);
        return;
      }
      Fatal::Fatal((Fatal *)local_1b0);
      std::operator<<((ostream *)(local_1b0 + 0x10),"can\'t set ");
      std::operator<<((ostream *)(local_1b0 + 0x10),(string *)key);
      Fatal::operator<<((Fatal *)local_1b0,(char (*) [19])": pass not enabled");
      goto LAB_00120c8a;
    }
    __lhs = pPVar4 + -1;
    bVar1 = std::operator!=(&__lhs->name,key);
  } while (bVar1);
  if (pPVar4[-1].argument.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged != true) {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&pPVar4[-1].argument,value);
    return;
  }
  Fatal::Fatal((Fatal *)local_1b0);
  std::operator<<((ostream *)(local_1b0 + 0x10),(string *)__lhs);
  std::operator<<((ostream *)(local_1b0 + 0x10)," already set to ");
  Fatal::operator<<((Fatal *)local_1b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pPVar4[-1].argument);
LAB_00120c8a:
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

void addPassArg(const std::string& key, const std::string& value) override {
    // Scan the current pass list for the last defined instance of a pass named
    // like the argument under consideration.
    for (auto i = passes.rbegin(); i != passes.rend(); i++) {
      if (i->name != key) {
        continue;
      }

      if (i->argument.has_value()) {
        Fatal() << i->name << " already set to " << *(i->argument);
      }

      // Found? Store the argument value there and return.
      i->argument = value;
      return;
    }

    // Not found? Store it globally if there is no pass with the same name.
    if (!PassRegistry::get()->containsPass(key)) {
      return ToolOptions::addPassArg(key, value);
    }

    // Not found, but we have a pass with the same name? Bail out.
    Fatal() << "can't set " << key << ": pass not enabled";
  }